

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O0

void __thiscall amrex::EBCellFlagFab::EBCellFlagFab(EBCellFlagFab *this,Box *b,int n,Arena *ar)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  BaseFab<amrex::EBCellFlag> *in_RSI;
  Arena *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  BaseFab<amrex::EBCellFlag>::BaseFab
            (in_RSI,(Box *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(int)((ulong)in_RCX >> 0x20),
             in_RDI);
  in_RDI->_vptr_Arena = (_func_int **)&PTR__EBCellFlagFab_01801e90;
  *(undefined4 *)&in_RDI[2].arena_info.device_use_hostalloc = 100;
  std::
  map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
  ::map((map<amrex::Box,_amrex::EBCellFlagFab::NumCells,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
         *)0x1176b65);
  return;
}

Assistant:

EBCellFlagFab::EBCellFlagFab (const Box& b, int n, Arena* ar)
    : BaseFab<EBCellFlag>(b,n,ar)
{}